

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ostream * Catch::operator<<(ostream *os,SourceLineInfo *info)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  char local_19;
  
  __s = info->file;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  local_19 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_19,1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, SourceLineInfo const &info) {
#ifndef __GNUG__
    os << info.file << '(' << info.line << ')';
#else
    os << info.file << ':' << info.line;
#endif
    return os;
  }